

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathNodeLeadingSorted(xmlNodeSetPtr nodes,xmlNodePtr node)

{
  int iVar1;
  xmlNodeSetPtr cur;
  xmlNodePtr val;
  ulong uVar2;
  ulong uVar3;
  
  if (node != (xmlNodePtr)0x0) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur != (xmlNodeSetPtr)0x0) {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
      if (nodes == (xmlNodeSetPtr)0x0) {
        return cur;
      }
      if (nodes->nodeNr == 0) {
        return cur;
      }
      if (nodes->nodeTab == (xmlNodePtr *)0x0) {
        return cur;
      }
      iVar1 = xmlXPathNodeSetContains(nodes,node);
      if (iVar1 == 0) {
        return cur;
      }
      uVar3 = 0;
      uVar2 = (ulong)(uint)nodes->nodeNr;
      if (nodes->nodeNr < 1) {
        uVar2 = uVar3;
      }
      do {
        if (uVar2 == uVar3) {
          return cur;
        }
        if ((long)uVar3 < (long)nodes->nodeNr) {
          val = nodes->nodeTab[uVar3];
        }
        else {
          val = (xmlNodePtr)0x0;
        }
        if (val == node) {
          return cur;
        }
        iVar1 = xmlXPathNodeSetAddUnique(cur,val);
        uVar3 = uVar3 + 1;
      } while (-1 < iVar1);
      xmlXPathFreeNodeSet(cur);
    }
    nodes = (xmlNodeSetPtr)0x0;
  }
  return nodes;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeLeadingSorted (xmlNodeSetPtr nodes, xmlNodePtr node) {
    int i, l;
    xmlNodePtr cur;
    xmlNodeSetPtr ret;

    if (node == NULL)
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes) ||
	(!xmlXPathNodeSetContains(nodes, node)))
	return(ret);

    l = xmlXPathNodeSetGetLength(nodes);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	if (cur == node)
	    break;
	if (xmlXPathNodeSetAddUnique(ret, cur) < 0) {
            xmlXPathFreeNodeSet(ret);
	    return(NULL);
        }
    }
    return(ret);
}